

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

void __thiscall wasm::Vacuum::visitBlock(Vacuum *this,Block *curr)

{
  ExpressionList *this_00;
  Expression *pEVar1;
  size_t *this_01;
  TypeUpdater *this_02;
  Expression *pEVar2;
  Type type;
  Expression **ppEVar3;
  bool bVar4;
  Expression *pEVar5;
  size_t sVar6;
  Type *pTVar7;
  Expression *pEVar8;
  ulong uVar9;
  Expression *pEVar10;
  undefined1 in_CL;
  Expression *pEVar11;
  ulong uVar12;
  uint uVar13;
  Expression *pEVar14;
  Type local_60;
  undefined1 local_58 [8];
  Iterator __begin3;
  int local_34;
  
  this_00 = &curr->list;
  pEVar10 = (Expression *)
            (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements;
  if (pEVar10 == (Expression *)0x0) {
    uVar13 = 0;
  }
  else {
    pEVar1 = (Expression *)((long)&pEVar10[-1].type.id + 7);
    this_02 = &this->typeUpdater;
    uVar13 = 0;
    local_34 = 2;
    pEVar14 = (Expression *)0x0;
    do {
      if ((Expression *)
          (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= pEVar14) {
LAB_00941be1:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pEVar2 = (this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
               .data[(long)pEVar14];
      if ((pEVar14 == pEVar1) &&
         (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id)) {
        bVar4 = ExpressionAnalyzer::isResultUsed
                          (&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                            .expressionStack,
                           (this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                           currFunction);
      }
      else {
        bVar4 = false;
      }
      pEVar11 = (Expression *)0x1;
      pEVar5 = optimize(this,pEVar2,bVar4,true);
      if (pEVar5 == (Expression *)0x0) {
        type.id = (pEVar2->type).id;
        pEVar5 = pEVar2;
        if (type.id < 2) {
          pEVar5 = (Expression *)0x0;
          if (type.id == 1) {
            pEVar5 = pEVar2;
          }
        }
        else {
          __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               type.id;
          bVar4 = wasm::Type::isNonNullable
                            ((Type *)&__begin3.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .index);
          if (!bVar4) {
            bVar4 = wasm::Type::isTuple((Type *)&__begin3.
                                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                                 .index);
            if (bVar4) {
              this_01 = &__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)0x0;
              local_58 = (undefined1  [8])this_01;
              sVar6 = wasm::Type::size((Type *)this_01);
              pEVar11 = (Expression *)
                        ((ulong)local_58 ^ (ulong)this_01 |
                        (ulong)__begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent ^ sVar6);
              pEVar8 = pEVar11;
              while (pEVar8 != (Expression *)0x0) {
                pTVar7 = wasm::Type::Iterator::operator*((Iterator *)local_58);
                local_60.id = pTVar7->id;
                bVar4 = wasm::Type::isNonNullable(&local_60);
                if (bVar4) {
                  if (pEVar8 != (Expression *)0x0) goto LAB_00941a7f;
                  break;
                }
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
                pEVar11 = (Expression *)
                          ((ulong)__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .parent ^ sVar6);
                pEVar8 = (Expression *)
                         ((ulong)local_58 ^
                          (ulong)&__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .index | (ulong)pEVar11);
              }
            }
            pEVar5 = LiteralUtils::makeZero
                               (type,(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                     .
                                     super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                     .super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                     .currModule);
          }
        }
      }
LAB_00941a7f:
      if (pEVar5 == (Expression *)0x0) {
        TypeUpdater::noteRecursiveRemoval(this_02,pEVar2);
        uVar13 = uVar13 + 1;
        bVar4 = false;
      }
      else {
        if (pEVar5 != pEVar2) {
          pEVar11 = (Expression *)0x0;
          TypeUpdater::noteReplacement(this_02,pEVar2,pEVar5,false);
          if ((Expression *)
              (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= pEVar14) goto LAB_00941be1;
          (this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
          [(long)pEVar14] = pEVar5;
        }
        if (0 < (int)uVar13) {
          pEVar2 = (Expression *)
                   (curr->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
          if ((pEVar2 <= pEVar14) ||
             (pEVar11 = (Expression *)((long)pEVar14 - (ulong)uVar13), pEVar2 <= pEVar11))
          goto LAB_00941be1;
          ppEVar3 = (this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
          ;
          ppEVar3[(long)pEVar11] = ppEVar3[(long)pEVar14];
          (this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
          [(long)pEVar14] = (Expression *)0x0;
        }
        uVar12 = (long)pEVar14 - (long)(int)uVar13;
        if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements <= uVar12) goto LAB_00941be1;
        bVar4 = false;
        if ((pEVar14 < pEVar1) &&
           (pEVar11 = (this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                      data[uVar12], (pEVar11->type).id == 1)) {
          uVar9 = uVar12 + 1 & 0xffffffff;
          if (uVar9 < (curr->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      usedElements) {
            uVar13 = local_34 - uVar13;
            do {
              pEVar11 = (Expression *)
                        (this_00->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                        data;
              if (*(Expression **)(&pEVar11->_id + uVar9 * 2) != (Expression *)0x0) {
                TypeUpdater::noteRecursiveRemoval
                          (this_02,*(Expression **)(&pEVar11->_id + uVar9 * 2));
              }
              uVar9 = (ulong)uVar13;
              uVar13 = uVar13 + 1;
            } while (uVar9 < (curr->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             .usedElements);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                    (&this_00->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     uVar12 + 1);
          TypeUpdater::maybeUpdateTypeToUnreachable(this_02,curr);
          uVar13 = 0;
          bVar4 = true;
        }
      }
      in_CL = SUB81(pEVar11,0);
      if (bVar4) break;
      pEVar14 = (Expression *)((long)&pEVar14->_id + 1);
      local_34 = local_34 + 1;
    } while (pEVar14 != pEVar10);
  }
  if (0 < (int)uVar13) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (long)pEVar10 - (ulong)uVar13);
    TypeUpdater::maybeUpdateTypeToUnreachable(&this->typeUpdater,curr);
  }
  pEVar10 = BlockUtils::simplifyToContents<wasm::Vacuum>
                      ((BlockUtils *)curr,(Block *)this,(Vacuum *)0x0,(bool)in_CL);
  replaceCurrent(this,pEVar10);
  return;
}

Assistant:

void visitBlock(Block* curr) {
    // compress out nops and other dead code
    int skip = 0;
    auto& list = curr->list;
    size_t size = list.size();
    for (size_t z = 0; z < size; z++) {
      auto* child = list[z];
      // The last element may be used.
      bool used =
        z == size - 1 && curr->type.isConcrete() &&
        ExpressionAnalyzer::isResultUsed(expressionStack, getFunction());
      auto* optimized = optimize(child, used, true);
      if (!optimized) {
        auto childType = child->type;
        if (childType.isConcrete()) {
          if (LiteralUtils::canMakeZero(childType)) {
            // We can't just skip a final concrete element, even if it isn't
            // used. Instead, replace it with something that's easy to optimize
            // out (for example, code-folding can merge out identical zeros at
            // the end of if arms).
            optimized = LiteralUtils::makeZero(childType, *getModule());
          } else {
            // Don't optimize it out.
            optimized = child;
          }
        } else if (childType == Type::unreachable) {
          // Don't try to optimize out an unreachable child (dce can do that
          // properly).
          optimized = child;
        }
      }
      if (!optimized) {
        typeUpdater.noteRecursiveRemoval(child);
        skip++;
      } else {
        if (optimized != child) {
          typeUpdater.noteReplacement(child, optimized);
          list[z] = optimized;
        }
        if (skip > 0) {
          list[z - skip] = list[z];
          list[z] = nullptr;
        }
        // if this is unreachable, the rest is dead code
        if (list[z - skip]->type == Type::unreachable && z < size - 1) {
          for (Index i = z - skip + 1; i < list.size(); i++) {
            auto* remove = list[i];
            if (remove) {
              typeUpdater.noteRecursiveRemoval(remove);
            }
          }
          list.resize(z - skip + 1);
          typeUpdater.maybeUpdateTypeToUnreachable(curr);
          skip = 0; // nothing more to do on the list
          break;
        }
      }
    }
    if (skip > 0) {
      list.resize(size - skip);
      typeUpdater.maybeUpdateTypeToUnreachable(curr);
    }
    // the block may now be a trivial one that we can get rid of and just leave
    // its contents
    replaceCurrent(BlockUtils::simplifyToContents(curr, this));
  }